

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O2

double __thiscall chrono::ChSolverADMM::_SolveBasic(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double *val;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer ppCVar5;
  ChConstraint *pCVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  AdmmStepType AVar10;
  Scalar *pSVar11;
  Scalar *pSVar12;
  ChLog *pCVar13;
  ChStreamOutAscii *pCVar14;
  _func_int **pp_Var15;
  ulong uVar16;
  int i_1;
  uint uVar17;
  int i;
  uint uVar18;
  long lVar19;
  Scalar SVar20;
  RealScalar RVar21;
  RealScalar RVar22;
  RealScalar RVar23;
  RealScalar RVar24;
  RealScalar RVar25;
  RealScalar mdeltalambda;
  RealScalar RVar26;
  RealScalar RVar27;
  undefined1 auVar28 [16];
  undefined8 extraout_XMM0_Qb;
  Index extraout_XMM0_Qb_00;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int nc;
  int nv;
  ChVectorDynamic<> l;
  double local_458;
  ChVectorDynamic<> z;
  ChVectorDynamic<> S;
  ChVectorDynamic<> vrho;
  ChVectorDynamic<> y;
  double rho_i;
  StorageIndex *local_3e8;
  Index IStack_3e0;
  ChVectorDynamic<> b;
  ChVectorDynamic<> z_old;
  ChVectorDynamic<> B;
  ChVectorDynamic<> v;
  ChVectorDynamic<> ckkt;
  Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> local_380;
  ChSparseMatrix H;
  ChVectorDynamic<> IS;
  ChVectorDynamic<> vsigma;
  ChVectorDynamic<> l_old;
  ChVectorDynamic<> k;
  undefined1 local_298 [24];
  RhsNested pMStack_280;
  variable_if_dynamic<long,__1> vStack_278;
  variable_if_dynamic<long,__1> vStack_270;
  Scalar *pSStack_268;
  ChTimer<double> m_timer_convert;
  ChVectorDynamic<> y_old;
  ChTimer<double> m_timer_solve;
  ChTimer<double> m_timer_factorize;
  ChSparseMatrix Cq;
  ChSparsityPatternLearner sparsity_pattern;
  ChVectorDynamic<> *local_e0 [2];
  ChSparseMatrix A;
  ChSparseMatrix E;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  m_timer_convert.m_start.__d.__r = (duration)0;
  m_timer_convert.m_end.__d.__r = (duration)0;
  m_timer_factorize.m_start.__d.__r = (duration)0;
  m_timer_factorize.m_end.__d.__r = (duration)0;
  m_timer_solve.m_start.__d.__r = (duration)0;
  m_timer_solve.m_end.__d.__r = (duration)0;
  rho_i = this->rho;
  iVar9 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  nc = iVar9;
  nv = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&v,&nv);
  if (iVar9 == 0) {
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&H,(long)nv,(long)nv);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>((Matrix<double,__1,_1,_0,__1,_1> *)&Cq,&nv);
    m_timer_convert.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nv,nv);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&H);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&H,&Cq);
    Eigen::SparseMatrix<double,_1,_int>::operator=
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,&H);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_rhs,(Matrix<double,__1,_1,_0,__1,_1> *)&Cq);
    ChTimer<double>::stop(&m_timer_convert);
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar13 = GetLog();
      pCVar14 = ChStreamOutAscii::operator<<
                          (&pCVar13->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      dVar37 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_convert);
      pCVar14 = ChStreamOutAscii::operator<<(pCVar14,dVar37);
      ChStreamOutAscii::operator<<(pCVar14,"s\n");
    }
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
    (*sysd->_vptr_ChSystemDescriptor[0x11])
              (sysd,&((this->LS_solver).
                      super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_sol);
    ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
    Eigen::internal::handmade_aligned_free(Cq._vptr_SparseMatrix);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&H);
    local_458 = 0.0;
  }
  else {
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&Cq,(long)iVar9,(long)nv);
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&E,(long)nc,(long)nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&k,&nv);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&b,&nc);
    Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&A,(long)nc + (long)nv,(long)nc + (long)nv);
    sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix =
         (_func_int **)
         CONCAT44(sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix._4_4_,
                  nc + nv);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&B,(int *)&sparsity_pattern);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&l,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&y,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&l_old,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&z_old,&nc);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&y_old,&nc);
    (*sysd->_vptr_ChSystemDescriptor[0x1b])(sysd,&Cq,0,&E,&k,&b,0,0,0);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&Cq);
    Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&E);
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y);
    }
    else {
      (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&l,0);
      (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&v,0);
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
           (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                     ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                      &Cq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&v);
      local_380 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                            ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)
                             &E.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>,
                             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
      ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                   *)local_298,
                  (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                   *)&IS,(MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                          *)&local_380);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                         *)local_298,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&b);
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize = H._8_8_;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerSize = H.m_outerSize;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerIndex =
           (StorageIndex *)H.m_innerSize;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerNonZeros = H.m_outerIndex;
      sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_data.m_indices =
           (StorageIndex *)H.m_data.m_values;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                (&y,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&sparsity_pattern);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>(&z,&l);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&S,&nc);
    if (this->precond == true) {
      uVar18 = 0;
      while( true ) {
        ppCVar5 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(sysd->vconstraints).
                       super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3;
        if (uVar16 <= uVar18) break;
        (*ppCVar5[uVar18]->_vptr_ChConstraint[6])();
        uVar18 = uVar18 + 1;
      }
      iVar9 = 0;
      uVar18 = 0xffffffff;
      while( true ) {
        uVar17 = uVar18;
        uVar18 = uVar17 + 1;
        if (uVar16 <= uVar18) break;
        pCVar6 = ppCVar5[uVar18];
        if (pCVar6->mode == CONSTRAINT_FRIC) {
          (&sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix)[iVar9] =
               (_func_int **)pCVar6->g_i;
          iVar9 = iVar9 + 1;
          if (iVar9 == 3) {
            dVar37 = ((double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix
                      + (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._8_8_ +
                     (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize) / 3.0;
            ppCVar5[uVar17 - 1]->g_i = dVar37;
            iVar9 = 0;
            ppCVar5[uVar17]->g_i = dVar37;
            pCVar6->g_i = dVar37;
          }
        }
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      iVar9 = 0;
      uVar18 = 0;
      while( true ) {
        ppCVar5 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(sysd->vconstraints).
                          super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3) <=
            (ulong)uVar18) break;
        pCVar6 = ppCVar5[uVar18];
        if (pCVar6->active == true) {
          dVar37 = pCVar6->g_i;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar37;
          if (dVar37 < 0.0) {
            SVar20 = sqrt(dVar37);
          }
          else {
            auVar29 = vsqrtsd_avx(auVar28,auVar28);
            SVar20 = auVar29._0_8_;
          }
          pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&S,
                               (long)iVar9,0);
          iVar9 = iVar9 + 1;
          *pSVar11 = SVar20;
        }
        uVar18 = uVar18 + 1;
      }
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&b,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&b,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&l,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&z,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&y,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&H);
    }
    else {
      sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix =
           (_func_int **)&DAT_3ff0000000000000;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S,
                 (Scalar *)&sparsity_pattern);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&vsigma,&nc);
    val = &this->sigma;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vsigma,val);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&vrho,&nc);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho,&rho_i);
    iVar9 = 0;
    uVar18 = 0;
    while( true ) {
      ppCVar5 = (sysd->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(sysd->vconstraints).
                        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3) <=
          (ulong)uVar18) break;
      pCVar6 = ppCVar5[uVar18];
      if (pCVar6->active == true) {
        if (pCVar6->mode == CONSTRAINT_LOCK) {
          SVar20 = this->rho_b;
          pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vrho,
                               (long)iVar9);
          *pSVar11 = SVar20;
        }
        iVar9 = iVar9 + 1;
      }
      uVar18 = uVar18 + 1;
    }
    m_timer_convert.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    Eigen::SparseMatrix<double,_1,_int>::resize
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,(long)nc + (long)nv,(long)nc + (long)nv);
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nc + nv,nc + nv);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&A);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&A,&B);
    if (this->precond == true) {
      H._vptr_SparseMatrix._0_4_ = nc + nv;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&IS,(int *)&H);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Ones
                ((ConstantReturnType *)local_298,(long)nv);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
      CommaInitializer<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 (Matrix<double,__1,_1,_0,__1,_1> *)&IS,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_298);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&H);
      local_380.m_lhs = (LhsNested)&IS;
      Eigen::
      Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>
      ::Product((Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>
                 *)local_298,(Lhs *)&local_380,&A);
      ckkt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)&IS;
      Eigen::
      Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_0>
      ::Product((Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
                 *)&H,(Lhs *)local_298,(Rhs *)&ckkt);
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)&A,
                 (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)&H);
      local_298._0_8_ = (LhsNested)&IS;
      H._0_16_ = Eigen::DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>>
                 ::operator*((DiagonalBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>>
                              *)local_298,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&B)
      ;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,1>>
                (&B,(Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                     *)&H);
      Eigen::internal::handmade_aligned_free
                (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
    }
    Eigen::SparseMatrix<double,_1,_int>::operator=
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,&A);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_rhs,&B);
    for (lVar19 = 0; lVar19 < nc; lVar19 = lVar19 + 1) {
      dVar37 = *val;
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vrho,
                           lVar19);
      local_3e8 = (StorageIndex *)*pSVar11;
      pSVar12 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                          (&((this->LS_solver).
                             super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_mat,nv + lVar19,nv + lVar19);
      *pSVar12 = *pSVar12 - ((double)local_3e8 + dVar37);
    }
    ChTimer<double>::stop(&m_timer_convert);
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar13 = GetLog();
      pCVar14 = ChStreamOutAscii::operator<<
                          (&pCVar13->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      dVar37 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_convert);
      pCVar14 = ChStreamOutAscii::operator<<(pCVar14,dVar37);
      ChStreamOutAscii::operator<<(pCVar14,"s\n");
    }
    m_timer_factorize.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    ChTimer<double>::stop(&m_timer_factorize);
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar13 = GetLog();
      pCVar14 = ChStreamOutAscii::operator<<
                          (&pCVar13->super_ChStreamOutAscii," Time for factorize : << ");
      dVar37 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_factorize);
      pCVar14 = ChStreamOutAscii::operator<<(pCVar14,dVar37);
      ChStreamOutAscii::operator<<(pCVar14,"s\n");
    }
    for (uVar18 = 0;
        (int)uVar18 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations;
        uVar18 = uVar18 + 1) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&l_old,&l);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&z_old,&z);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&y_old,&y);
      local_e0[0] = &b;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&local_380,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&vsigma,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&IS,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         *)&local_380,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      Eigen::
      MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_298,
                  (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                   *)local_e0,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&IS);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                         *)local_298,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&ckkt,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&H);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::
      CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 &((this->LS_solver).
                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_rhs,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&k);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&H,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&ckkt);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&H);
      m_timer_solve.m_start.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
      ChTimer<double>::stop(&m_timer_solve);
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar13 = GetLog();
        pCVar14 = ChStreamOutAscii::operator<<
                            (&pCVar13->super_ChStreamOutAscii," Time for solve : << ");
        dVar37 = ChTimer<double>::GetTimeSecondsIntermediate(&m_timer_solve);
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,dVar37);
        ChStreamOutAscii::operator<<(pCVar14,"s\n");
      }
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<int,int>
                ((Type *)local_298,
                 (DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 &((this->LS_solver).
                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_sol,(long)nv,0,nc,1);
      H.m_outerIndex = (StorageIndex *)vStack_278.m_value;
      H.m_innerNonZeros = (StorageIndex *)vStack_270.m_value;
      H.m_data.m_values = pSStack_268;
      H._8_8_ = local_298._8_8_;
      H._vptr_SparseMatrix = (_func_int **)local_298._0_8_;
      H.m_outerSize = local_298._16_8_;
      H.m_innerSize = (Index)pMStack_280;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>const>>
                (&l,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>
                     *)&H);
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<int,int>
                ((Type *)&H,
                 (DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                 &((this->LS_solver).
                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_sol,0,0,nv,1);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,_1,false>>
                (&v,(Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false> *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_298,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_298);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                (&z,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)&H);
      (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&z);
      local_380.m_lhs = (LhsNested)&vrho;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
      Eigen::
      Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_1>
      ::Product((Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>
                 *)local_298,(Lhs *)&local_380,(Rhs *)&IS);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&y,
                 (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
                  *)local_298);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,1>const>>
                (&y,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>
                     *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_298,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        *)local_298,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      RVar21 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      this->r_prim = RVar21;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
      RVar22 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z_old);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_298,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  *)&IS,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,local_298,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      RVar23 = Eigen::internal::
               lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
               ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&H);
      this->r_dual = RVar23;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)local_298,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z_old);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
      ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                  *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                        *)local_298,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho);
      local_3e8 = (StorageIndex *)
                  Eigen::internal::
                  lpNorm_selector<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_-1>
                  ::run((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&H);
      IStack_3e0 = extraout_XMM0_Qb_00;
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar13 = GetLog();
        pCVar14 = ChStreamOutAscii::operator<<(&pCVar13->super_ChStreamOutAscii,"ADMM iter=");
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,uVar18);
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14," prim=");
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,this->r_prim);
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14," dual=");
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,this->r_dual);
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,"  rho=");
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,rho_i);
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,"  tols=");
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,this->tol_prim);
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14," ");
        pCVar14 = ChStreamOutAscii::operator<<(pCVar14,this->tol_dual);
        ChStreamOutAscii::operator<<(pCVar14,"\n");
      }
      if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&IS,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
        ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&H,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                          *)&IS,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
        RVar24 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)&H);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_380,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&z,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z_old);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
        ::cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_298,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    *)&local_380,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
        RVar25 = Eigen::
                 MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)local_298);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                  ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l_old);
        mdeltalambda = Eigen::
                       MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                       ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)&H);
        ChIterativeSolverVI::AtIterationEnd
                  (&this->super_ChIterativeSolverVI,RVar25 + RVar24,mdeltalambda,uVar18);
      }
      if ((this->r_prim < this->tol_prim) && (this->r_dual < this->tol_dual)) {
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar13 = GetLog();
          pCVar14 = ChStreamOutAscii::operator<<
                              (&pCVar13->super_ChStreamOutAscii,"ADMM converged ok! at iter=");
          pCVar14 = ChStreamOutAscii::operator<<(pCVar14,uVar18);
          ChStreamOutAscii::operator<<(pCVar14,"\n");
        }
        Eigen::internal::handmade_aligned_free
                  (ckkt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
        break;
      }
      if ((int)uVar18 % this->stepadjust_each == 0) {
        auVar29 = ZEXT816(0x3ff0000000000000);
        AVar10 = this->stepadjust_type;
        if (AVar10 == BALANCED_UNSCALED) {
          auVar29._0_8_ = RVar22 / (double)local_3e8;
          auVar29._8_8_ = extraout_XMM0_Qb;
          if (auVar29._0_8_ < 0.0) {
            auVar33._0_8_ = sqrt(auVar29._0_8_);
            auVar33._8_56_ = extraout_var;
            auVar29 = auVar33._0_16_;
          }
          else {
            auVar29 = vsqrtsd_avx(auVar29,auVar29);
          }
          AVar10 = this->stepadjust_type;
        }
        if (AVar10 == BALANCED_FAST) {
          RVar26 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                             ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&z);
          RVar27 = Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                             ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&l);
          auVar34._0_8_ =
               Eigen::internal::lpNorm_selector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::run
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&y);
          auVar34._8_56_ = extraout_var_00;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = RVar26;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = RVar27;
          auVar29 = vmaxsd_avx(auVar38,auVar4);
          auVar29 = vunpcklpd_avx(auVar29,auVar34._0_16_);
          auVar30._0_8_ = auVar29._0_8_ + 1e-10;
          auVar30._8_8_ = auVar29._8_8_ + 1e-10;
          auVar7._8_8_ = extraout_XMM0_Qb;
          auVar7._0_8_ = RVar22;
          auVar8._8_8_ = IStack_3e0;
          auVar8._0_8_ = local_3e8;
          auVar29 = vunpcklpd_avx(auVar7,auVar8);
          auVar29 = vdivpd_avx(auVar29,auVar30);
          auVar4 = vshufpd_avx(auVar29,auVar29,1);
          auVar31._0_8_ = auVar29._0_8_ / (auVar4._0_8_ + 1e-10);
          auVar31._8_8_ = auVar29._8_8_;
          if (auVar31._0_8_ < 0.0) {
            auVar35._0_8_ = sqrt(auVar31._0_8_);
            auVar35._8_56_ = extraout_var_01;
            auVar29 = auVar35._0_16_;
          }
          else {
            auVar29 = vsqrtsd_avx(auVar31,auVar31);
          }
          AVar10 = this->stepadjust_type;
        }
        if (AVar10 == BALANCED_RANGE) {
          auVar2._0_8_ = this->r_prim;
          auVar2._8_8_ = this->r_dual;
          auVar3._0_8_ = this->tol_prim;
          auVar3._8_8_ = this->tol_dual;
          auVar29 = vdivpd_avx(auVar2,auVar3);
          auVar4 = vshufpd_avx(auVar29,auVar29,1);
          auVar32._0_8_ = auVar29._0_8_ / (auVar4._0_8_ + 1e-10);
          auVar32._8_8_ = auVar29._8_8_;
          if (auVar32._0_8_ < 0.0) {
            auVar36._0_8_ = sqrt(auVar32._0_8_);
            auVar36._8_56_ = extraout_var_02;
            auVar29 = auVar36._0_16_;
          }
          else {
            auVar29 = vsqrtsd_avx(auVar32,auVar32);
          }
        }
        auVar39._8_8_ = 0;
        auVar39._0_8_ = this->stepadjust_maxfactor;
        auVar40._0_8_ = 1.0 / this->stepadjust_maxfactor;
        auVar40._8_8_ = 0;
        auVar29 = vmaxsd_avx(auVar40,auVar29);
        auVar29 = vminsd_avx(auVar39,auVar29);
        dVar37 = auVar29._0_8_;
        if ((this->stepadjust_threshold < dVar37) || (dVar37 < 1.0 / this->stepadjust_threshold)) {
          H._0_16_ = ZEXT816(0);
          pp_Var15 = (_func_int **)std::chrono::_V2::system_clock::now();
          H._vptr_SparseMatrix = pp_Var15;
          for (lVar19 = 0; lVar19 < nc; lVar19 = lVar19 + 1) {
            dVar1 = *val;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vrho
                                 ,lVar19);
            local_3e8 = (StorageIndex *)*pSVar11;
            pSVar12 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                (&((this->LS_solver).
                                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->m_mat,nv + lVar19,nv + lVar19);
            *pSVar12 = (double)local_3e8 + dVar1 + *pSVar12;
          }
          rho_i = dVar37 * rho_i;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&vrho,&rho_i);
          iVar9 = 0;
          uVar17 = 0;
          while( true ) {
            ppCVar5 = (sysd->vconstraints).
                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(sysd->vconstraints).
                              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >> 3) <=
                (ulong)uVar17) break;
            pCVar6 = ppCVar5[uVar17];
            if (pCVar6->active == true) {
              if (pCVar6->mode == CONSTRAINT_LOCK) {
                SVar20 = this->rho_b;
                pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                     &vrho,(long)iVar9);
                *pSVar11 = SVar20;
              }
              iVar9 = iVar9 + 1;
            }
            uVar17 = uVar17 + 1;
          }
          for (lVar19 = 0; lVar19 < nc; lVar19 = lVar19 + 1) {
            dVar37 = *val;
            pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&vrho
                                 ,lVar19);
            local_3e8 = (StorageIndex *)*pSVar11;
            pSVar12 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                (&((this->LS_solver).
                                   super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->m_mat,nv + lVar19,nv + lVar19);
            *pSVar12 = *pSVar12 - ((double)local_3e8 + dVar37);
          }
          (*(((this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
          ChTimer<double>::stop((ChTimer<double> *)&H);
          if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
            pCVar13 = GetLog();
            pCVar14 = ChStreamOutAscii::operator<<
                                (&pCVar13->super_ChStreamOutAscii," Time for re-factorize : << ");
            dVar37 = ChTimer<double>::GetTimeSecondsIntermediate((ChTimer<double> *)&H);
            pCVar14 = ChStreamOutAscii::operator<<(pCVar14,dVar37);
            ChStreamOutAscii::operator<<(pCVar14,"s\n");
          }
        }
      }
      Eigen::internal::handmade_aligned_free
                (ckkt.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)&H,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&l,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              (&l,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&H);
    (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&l);
    (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&v);
    local_458 = this->r_dual;
    ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
    Eigen::internal::handmade_aligned_free
              (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
    ;
    Eigen::internal::handmade_aligned_free
              (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    Eigen::internal::handmade_aligned_free
              (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&A);
    Eigen::internal::handmade_aligned_free
              (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&E);
    Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&Cq);
  }
  Eigen::internal::handmade_aligned_free
            (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return local_458;
}

Assistant:

double ChSolverADMM::_SolveBasic(ChSystemDescriptor& sysd) {

    ChTimer<> m_timer_convert;
    ChTimer<> m_timer_factorize;
    ChTimer<> m_timer_solve;

    double rho_i = this->rho;

    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();

    int nc = sysd.CountActiveConstraints();
    int nv = sysd.CountActiveVariables();

    ChVectorDynamic<> v(nv);

    // shortcut for the case of no constraints:
    if (nc == 0) {

        ChSparseMatrix H(nv, nv);
        ChVectorDynamic<> k(nv);


        m_timer_convert.start();

        // sysd.ConvertToMatrixForm(0, &LS_solver->A(), 0, &LS_solver->b(), 0, 0, 0);
        //sysd.ConvertToMatrixForm(0, &LS_solver->A(), 0, &LS_solver->b(), 0, 0, 0);
        // much faster to fill brand new sparse matrices??!!

        ChSparsityPatternLearner sparsity_pattern(nv, nv);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0); 
        sparsity_pattern.Apply(H);
        sysd.ConvertToMatrixForm(&H,&k);  
        LS_solver->A() = H; 
        LS_solver->b() = k; 

        m_timer_convert.stop();
        if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

        // v = H\k
        LS_solver->SetupCurrent();
        LS_solver->SolveCurrent();

        //v = LS_solver->x();
        sysd.FromVectorToVariables(LS_solver->x());

        return 0;
    }
        
    ChSparseMatrix Cq(nc,nv);
    ChSparseMatrix E(nc,nc);
    ChVectorDynamic<> k(nv);
    ChVectorDynamic<> b(nc);

    ChSparseMatrix    A(nv+nc,nv+nc);
    ChVectorDynamic<> B(nv+nc);
    //ChVectorDynamic<> X(nv+nc);


    ChVectorDynamic<> l(nc);
    ChVectorDynamic<> z(nc);
    ChVectorDynamic<> y(nc);

    ChVectorDynamic<> l_old(nc);
    ChVectorDynamic<> z_old(nc);
    ChVectorDynamic<> y_old(nc);
    
    sysd.ConvertToMatrixForm(&Cq, 0, &E, &k, &b, 0);
    Cq.makeCompressed();
    E.makeCompressed();

    if (!this->m_warm_start) {
        l.setZero();
        z.setZero();
        y.setZero();
    }
    else
    {
        // warmstarted l:
        sysd.FromConstraintsToVector(l, false);

        // warmstarted v:
        //v = H\(k + D*l); // PERFORMANCE HIT, probably better reuse last v if possible..
        sysd.FromVariablesToVector(v, false); // this works supposing that variables have been warmstarted with "v" too, otherwise:  

        // warmstarted y:
        // the following correct only if r_dual was approx.=0. //***TODO*** as parameter
        y = - (Cq*v - E*l + b); //  dual residual exploiting the kkt form instead of - (N*l+r), faster!
            
        /*
        GetLog() << "Y warmastarted:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
        */
        
        // warmstarted z:
        z = l; //  warm start also this - should project? //***TODO*** as parameter
        //sysd.ConstraintsProject(z);

        // y_hat  = y;   // only for spectral stepsize
    }

    ChVectorDynamic<> S(nc);

    if (this->precond == true) {
        // Compute diagonal values of N , only mass effect, neglecting stiffness for the moment, TODO
        //  g_i=[Cq_i]*[invM_i]*[Cq_i]' 
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Update_auxiliary();

        // Average all g_i for the triplet of contact constraints n,u,v.
        int j_friction_comp = 0;
        double gi_values[3];
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
                j_friction_comp++;
                if (j_friction_comp == 3) {
                    double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                    mconstraints[ic - 2]->Set_g_i(average_g_i);
                    mconstraints[ic - 1]->Set_g_i(average_g_i);
                    mconstraints[ic - 0]->Set_g_i(average_g_i);
                    j_friction_comp = 0;
                }
            }
        }
        // The vector with the diagonal of the N matrix
        S.setZero();
        int d_i = 0;
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive()) {
                S(d_i, 0) = sqrt(mconstraints[ic]->Get_g_i());  // square root of diagonal of N, just mass matrices considered, no stiffness matrices anyway
                ++d_i;
            }
        // Now we should scale Cq, E, b as
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        
        // but to avoid storing Cq and E and assembly in A, we postpone this by scaling the entire A matrix later via a IS*A*IS operation
        
        // b = diag(S)*b;
        b = b.cwiseProduct(S);

        // warm started values must be scaled too
        l = l.cwiseQuotient(S); // from l to \breve{l}
        z = z.cwiseQuotient(S); 
        y = y.cwiseProduct(S);

    }
    else {
        S.setConstant(1);
    }  

    // vsigma = ones(nconstr,1)*sigma;
    ChVectorDynamic<> vsigma(nc); // not needed
    vsigma.setConstant(this->sigma);
    

    // vrho = ones(nconstr,1)*rho;
    ChVectorDynamic<> vrho(nc);
    vrho.setConstant(rho_i);

    // vrho(fric==-2) = rho_b;          // special step for bilateral joints
    int s_c = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive()) {
            if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                vrho(s_c) = rho_b;
            s_c++;
        }
    }
 
    // FACTORIZATION
    //
    // A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    
    m_timer_convert.start();

    LS_solver->A().resize(nv + nc, nv + nc); // otherwise conservativeResize in ConvertToMatrixForm() causes error

    //sysd.ConvertToMatrixForm(&LS_solver->A(),&LS_solver->b());  // A = [M, Cq'; Cq, E ];
    // much faster to fill brand new sparse matrices??!!
    ChSparsityPatternLearner sparsity_pattern(nv + nc, nv + nc);
    sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
    sparsity_pattern.Apply(A);

    sysd.ConvertToMatrixForm(&A,&B);  // A = [M, Cq'; Cq, E ]; 

    if (this->precond) {
        // the following is equivalent to having scaled 
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        ChVectorDynamic<> IS(nv + nc);
        IS << Eigen::VectorXd::Ones(nv) , S;
        A = IS.asDiagonal() * A * IS.asDiagonal();
        B = IS.asDiagonal() * B; // not needed? B here only factorization...
    }

    LS_solver->A() = A; 
    LS_solver->b() = B; 

    for (int i = 0; i < nc; ++i)
        LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    m_timer_convert.stop();
    if (this->verbose)
        GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

    m_timer_factorize.start();

    LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

    m_timer_factorize.stop();
    if (this->verbose)
        GetLog() << " Time for factorize : << " << m_timer_factorize.GetTimeSecondsIntermediate() << "s\n";

    /*
    res_story.r_prim=zeros(1,1);
    res_story.r_dual_Nlry=zeros(1,1);
    res_story.r_dual=zeros(1,1);
    res_story.r_combined_pre=zeros(1,1);
    res_story.r_combined=zeros(1,1);
    res_story.r_deltal=zeros(1,1);
    res_story.r_rho=zeros(1,1);
    res_story.r_violation=zeros(1,1);
    */

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // diagnostic
        l_old = l;
        z_old = z;
        y_old = y;

        // X   (lambda)

        // SOLVE LINEAR SYSTEM HERE
        // ckkt = -bkkt + (vsigma+vrho).*z - y;

        ChVectorDynamic<> ckkt = -b + (vsigma + vrho).cwiseProduct(z) - y;
        LS_solver->b() << k, ckkt;  // B = [k;ckkt];

        m_timer_solve.start();

        LS_solver->SolveCurrent();                                                      // LU forward/backsolve ++++++++++++++++++++++++++++++++++++++
        
        m_timer_solve.stop();
        if (this->verbose) GetLog() << " Time for solve : << " << m_timer_solve.GetTimeSecondsIntermediate() << "s\n";

        // x = dA\B;      // A* x = B  with x = [v, -l]    
        l = -LS_solver->x().block(nv, 0, nc, 1);
        v =  LS_solver->x().block(0, 0, nv, 1);
        

        // Z

        //    z = project_orthogonal(l + y. / vrho, fric); 
        z = l + y.cwiseQuotient(vrho);
        sysd.ConstraintsProject(z); 

        // Y

        y = y + vrho.asDiagonal() * (l - z);


        // y_hat = y + vrho .* (l - z_old);   


        // Compute residuals for tolerances


        r_prim = ((z - l).cwiseProduct(S)).lpNorm<Eigen::Infinity>();     //r_prim     = norm((z - l).*S, inf);   
        double r_prim_pre = (z - l).lpNorm<Eigen::Infinity>();              //r_prim_pre = norm((z - l)   , inf); 

        r_dual = (((z - z_old).cwiseProduct(vrho)).cwiseQuotient(S)).lpNorm<Eigen::Infinity>(); // r_dual = norm((vrho.*(z - z_old)). / S, inf); % even faster!See book of Boyd.But coincides only for alpha = 1 !!!
        double r_dual_pre = ((z - z_old).cwiseProduct(vrho)).lpNorm<Eigen::Infinity>();  // r_dual_pre     = norm((vrho.*(z - z_old))   ,inf); 

        //r_combined = norm((z - l).*S, 2) + norm((z - z_old). / S, 2);% combined res.in original metric
        //r_combined_pre = norm((z - l), 2) + norm((z - z_old), 2);% combined res.in precond.metric

        /*
        res_story.r_prim(j) = r_prim;
        res_story.r_dual_Nlry(j) = r_dual_Nlry;
        res_story.r_dual(j) = r_dual;
        res_story.r_combined_pre(j) = r_combined_pre;
        res_story.r_combined(j) = r_combined;
        res_story.r_rho(j) = rho_i;
        res_story.r_deltal(j) = norm((l - l_old).*S, inf);% diagnostic
        */

        if (this->verbose)
            GetLog() << "ADMM iter=" << iter << " prim=" << r_prim << " dual=" << r_dual << "  rho=" << rho_i << "  tols=" << this->tol_prim << " " << this->tol_dual <<  "\n";

        // For recording into violation history, if debugging
        if (this->record_violation_history) {
            // combined residual 
            double r_combined = ((z - l).cwiseProduct(S)).norm() + ((z - z_old).cwiseQuotient(S)).norm();
            AtIterationEnd(r_combined, (l - l_old).norm(), iter);
        }

        // Termination:
        if ((r_prim < this->tol_prim) && (r_dual < this->tol_dual)) {
            if (this->verbose)
                GetLog() << "ADMM converged ok! at iter=" << iter << "\n";
            break;
        }



        // once in a while update the rho step parameter
        if ((iter % this->stepadjust_each) == 0) {

            double rhofactor = 1; // default do not shrink / enlarge

            if (this->stepadjust_type == AdmmStepType::NONE) {
                rhofactor = 1.;
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_UNSCALED) {
                rhofactor = sqrt(r_prim_pre / r_dual_pre);
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_FAST) {
                double r_prim_scaled = r_prim_pre / (ChMax(z.lpNorm<Eigen::Infinity>(), l.lpNorm<Eigen::Infinity>()) + 1e-10); // maybe norm(l, inf) very similar to norm(z, inf)
                double r_dual_scaled = r_dual_pre / (y.lpNorm<Eigen::Infinity>() + 1e-10);  //  as in "ADMM Penalty Parameter Selection by Residual Balancing", Brendt Wohlberg
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_RANGE) {
                double r_prim_scaled = r_prim / this->tol_prim;
                double r_dual_scaled = r_dual / this->tol_dual;
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }


            // safeguards against extreme shrinking
            if (rhofactor < 1.0 / this->stepadjust_maxfactor) {
                rhofactor = 1.0 / this->stepadjust_maxfactor;
            }
            if (rhofactor > this->stepadjust_maxfactor) {
                rhofactor = this->stepadjust_maxfactor;
            }

            if ((rhofactor > this->stepadjust_threshold) || (rhofactor < 1.0 / this->stepadjust_threshold)) {

                ChTimer<> m_timer_refactorize;
                m_timer_refactorize.start();

                // Avoid rebuilding all sparse matrix: 
                // A) just remove old rho with -= :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) -= -(sigma + vrho(i));

                // Update rho
                rho_i = rho_i * rhofactor;

                // vrho(fric == -2) = rho_b; //  special step for bilateral joints
                vrho.setConstant(rho_i);
                s_c = 0;
                for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
                    if (mconstraints[ic]->IsActive()) {
                        if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                            vrho(s_c) = rho_b;
                        s_c++;
                    }
                }

                // UPDATE FACTORIZATION
                //
                //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];
                //
                // To avoid rebuilding A, we just removed the rho step from the diagonal in A), and now: 
                // B) add old rho with += :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));

                LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

                m_timer_refactorize.stop();
                if (this->verbose) GetLog() << " Time for re-factorize : << " << m_timer_refactorize.GetTimeSecondsIntermediate() << "s\n";
            }

        } // end step adjust


    } // end iteration

    l = l.cwiseProduct(S);

    /*
    GetLog() << "Y resulting:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
    */

    sysd.FromVectorToConstraints(l);
    sysd.FromVectorToVariables(v);

    return r_dual;
}